

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O1

void __thiscall insyde_fdm_t::_read(insyde_fdm_t *this)

{
  kstream *pkVar1;
  fdm_extensions_t *pfVar2;
  __uniq_ptr_data<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>,_true,_true>
  _Var3;
  long lVar4;
  fdm_board_ids_t *pfVar5;
  fdm_entries_t *pfVar6;
  uint8_t uVar7;
  uint32_t uVar8;
  uint64_t uVar9;
  kstream *pkVar10;
  fdm_board_ids_t *this_00;
  fdm_entries_t *this_01;
  undefined8 uVar11;
  pointer *__ptr;
  fdm_extensions_t *unaff_R14;
  pointer __p;
  undefined1 local_38 [32];
  
  uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar8;
  uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_store_size = uVar8;
  uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_data_offset = uVar8;
  uVar8 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_entry_size = uVar8;
  uVar7 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_entry_format = uVar7;
  uVar7 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_revision = uVar7;
  uVar7 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_num_extensions = uVar7;
  uVar7 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_checksum = uVar7;
  uVar9 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_fd_base_address = uVar9;
  this->n_extensions = true;
  if (2 < this->m_revision) {
    this->n_extensions = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              ((string *)local_38,(this->super_kstruct).m__io,(ulong)this->m_num_extensions << 2);
    std::__cxx11::string::operator=((string *)&this->m__raw_extensions,(string *)local_38);
    if ((kstream *)local_38._0_8_ != (kstream *)(local_38 + 0x10)) {
      operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
    }
    pkVar10 = (kstream *)operator_new(0x198);
    kaitai::kstream::kstream(pkVar10,&this->m__raw_extensions);
    local_38._0_8_ = (kstream *)0x0;
    pkVar1 = (this->m__io__raw_extensions)._M_t.
             super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
             super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
             super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
    (this->m__io__raw_extensions)._M_t.
    super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
    super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
    super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = pkVar10;
    if (pkVar1 != (kstream *)0x0) {
      std::default_delete<kaitai::kstream>::operator()
                ((default_delete<kaitai::kstream> *)&this->m__io__raw_extensions,pkVar1);
    }
    if ((kstream *)local_38._0_8_ != (kstream *)0x0) {
      std::default_delete<kaitai::kstream>::operator()
                ((default_delete<kaitai::kstream> *)local_38,(kstream *)local_38._0_8_);
    }
    unaff_R14 = (fdm_extensions_t *)operator_new(0x28);
    fdm_extensions_t::fdm_extensions_t
              (unaff_R14,
               (this->m__io__raw_extensions)._M_t.
               super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
               super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
               super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,this->m__root);
    pfVar2 = (this->m_extensions)._M_t.
             super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
             .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl;
    (this->m_extensions)._M_t.
    super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
    .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl = unaff_R14;
    if (pfVar2 != (fdm_extensions_t *)0x0) {
      (**(code **)((long)(pfVar2->super_kstruct)._vptr_kstruct + 8))();
    }
  }
  this->n_board_ids = true;
  if (2 < this->m_revision) {
    _Var3.
    super___uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_false>
    ._M_head_impl =
         (((this->m_extensions)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_extensions_t_*,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false>._M_head_impl)->
         m_extensions)._M_t.
         super___uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
    ;
    lVar4 = *(long *)_Var3.
                     super___uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_false>
                     ._M_head_impl;
    if ((ulong)(*(long *)((long)_Var3.
                                super___uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                                .
                                super__Head_base<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_false>
                                ._M_head_impl + 8) - lVar4 >> 3) < 2) {
      uVar11 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,1);
      operator_delete(unaff_R14,0x30);
      _Unwind_Resume(uVar11);
    }
    if (*(short *)(*(long *)(lVar4 + 8) + 0x12) != 0) {
      this->n_board_ids = false;
      this_00 = (fdm_board_ids_t *)operator_new(0x30);
      fdm_board_ids_t::fdm_board_ids_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
      pfVar5 = (this->m_board_ids)._M_t.
               super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
               .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl;
      (this->m_board_ids)._M_t.
      super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
      .super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>._M_head_impl = this_00;
      if (pfVar5 != (fdm_board_ids_t *)0x0) {
        (**(code **)((long)(pfVar5->super_kstruct)._vptr_kstruct + 8))();
      }
    }
  }
  kaitai::kstream::read_bytes_abi_cxx11_
            ((string *)local_38,(this->super_kstruct).m__io,
             (ulong)(this->m_store_size - this->m_data_offset));
  std::__cxx11::string::operator=((string *)&this->m__raw_entries,(string *)local_38);
  if ((kstream *)local_38._0_8_ != (kstream *)(local_38 + 0x10)) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  pkVar10 = (kstream *)operator_new(0x198);
  kaitai::kstream::kstream(pkVar10,&this->m__raw_entries);
  local_38._0_8_ = (kstream *)0x0;
  pkVar1 = (this->m__io__raw_entries)._M_t.
           super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
           super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
           super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl;
  (this->m__io__raw_entries)._M_t.
  super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
  super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
  super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = pkVar10;
  if (pkVar1 != (kstream *)0x0) {
    std::default_delete<kaitai::kstream>::operator()
              ((default_delete<kaitai::kstream> *)&this->m__io__raw_entries,pkVar1);
  }
  if ((kstream *)local_38._0_8_ != (kstream *)0x0) {
    std::default_delete<kaitai::kstream>::operator()
              ((default_delete<kaitai::kstream> *)local_38,(kstream *)local_38._0_8_);
  }
  this_01 = (fdm_entries_t *)operator_new(0x28);
  fdm_entries_t::fdm_entries_t
            (this_01,(this->m__io__raw_entries)._M_t.
                     super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>
                     .super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,
             this->m__root);
  pfVar6 = (this->m_entries)._M_t.
           super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
           .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl;
  (this->m_entries)._M_t.
  super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  .super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>._M_head_impl = this_01;
  if (pfVar6 != (fdm_entries_t *)0x0) {
    (**(code **)((long)(pfVar6->super_kstruct)._vptr_kstruct + 8))();
  }
  return;
}

Assistant:

void insyde_fdm_t::_read() {
    m_signature = m__io->read_u4le();
    m_store_size = m__io->read_u4le();
    m_data_offset = m__io->read_u4le();
    m_entry_size = m__io->read_u4le();
    m_entry_format = m__io->read_u1();
    m_revision = m__io->read_u1();
    m_num_extensions = m__io->read_u1();
    m_checksum = m__io->read_u1();
    m_fd_base_address = m__io->read_u8le();
    n_extensions = true;
    if (revision() > 2) {
        n_extensions = false;
        m__raw_extensions = m__io->read_bytes((num_extensions() * 4));
        m__io__raw_extensions = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_extensions));
        m_extensions = std::unique_ptr<fdm_extensions_t>(new fdm_extensions_t(m__io__raw_extensions.get(), this, m__root));
    }
    n_board_ids = true;
    if ( ((revision() > 2) && (extensions()->extensions()->at(1)->count() > 0)) ) {
        n_board_ids = false;
        m_board_ids = std::unique_ptr<fdm_board_ids_t>(new fdm_board_ids_t(m__io, this, m__root));
    }
    m__raw_entries = m__io->read_bytes((store_size() - data_offset()));
    m__io__raw_entries = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_entries));
    m_entries = std::unique_ptr<fdm_entries_t>(new fdm_entries_t(m__io__raw_entries.get(), this, m__root));
}